

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

int __thiscall
ring_buffer_base<cubeb_log_message>::available_write_internal
          (ring_buffer_base<cubeb_log_message> *this,int read_index,int write_index)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  int rv;
  undefined4 local_14;
  
  local_14 = (in_ESI - in_EDX) + -1;
  if (in_ESI <= in_EDX) {
    iVar1 = storage_capacity(in_RDI);
    local_14 = iVar1 + local_14;
  }
  return local_14;
}

Assistant:

int available_write_internal(int read_index, int write_index) const
  {
    /* We substract one element here to always keep at least one sample
     * free in the buffer, to distinguish between full and empty array. */
    int rv = read_index - write_index - 1;
    if (write_index >= read_index) {
      rv += storage_capacity();
    }
    return rv;
  }